

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.h
# Opt level: O1

uint32_t __thiscall
asmjit::ZoneVector<asmjit::Pass_*>::indexOf(ZoneVector<asmjit::Pass_*> *this,Pass **val)

{
  size_type sVar1;
  long lVar2;
  
  sVar1 = (this->super_ZoneVectorBase)._size;
  if (sVar1 != 0) {
    lVar2 = 0;
    do {
      if (*(Pass **)((long)(this->super_ZoneVectorBase)._data + lVar2 * 8) == *val) {
        return (uint32_t)lVar2;
      }
      lVar2 = lVar2 + 1;
    } while (sVar1 != (size_type)lVar2);
  }
  return 0xffffffff;
}

Assistant:

inline uint32_t indexOf(const T& val) const noexcept {
    const T* data = static_cast<const T*>(_data);
    uint32_t size = _size;

    for (uint32_t i = 0; i < size; i++)
      if (data[i] == val)
        return i;
    return Globals::kNotFound;
  }